

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readptm.c
# Opt level: O1

int it_ptm_read_sample_header(IT_SAMPLE *sample,int32 *offset,DUMBFILE *f)

{
  undefined4 uVar1;
  undefined4 uVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  int32 iVar6;
  
  uVar4 = dumbfile_getc(f);
  dumbfile_getnc((char *)sample->filename,0xc,f);
  sample->filename[0xc] = '\0';
  iVar5 = dumbfile_getc(f);
  sample->default_volume = (uchar)iVar5;
  iVar5 = dumbfile_igetw(f);
  sample->C5_speed = iVar5 * 2;
  dumbfile_skip(f,2);
  iVar6 = dumbfile_igetl(f);
  *offset = iVar6;
  iVar6 = dumbfile_igetl(f);
  sample->length = iVar6;
  iVar6 = dumbfile_igetl(f);
  sample->loop_start = iVar6;
  iVar6 = dumbfile_igetl(f);
  sample->loop_end = iVar6;
  dumbfile_skip(f,0xe);
  dumbfile_getnc((char *)sample,0x1c,f);
  sample->name[0x1c] = '\0';
  dumbfile_skip(f,4);
  if ((uVar4 & 3) == 0) {
    sample->flags = sample->flags & 0xfe;
    goto LAB_006e2319;
  }
  sample->global_volume = '@';
  sample->flags = ((byte)uVar4 * '\b' & 0x40 | ((byte)uVar4 & 4) << 2) + 1;
  if ((uVar4 & 0x10) != 0) {
    sample->flags = sample->flags | 2;
    uVar1 = sample->length;
    uVar2 = sample->loop_start;
    sample->length = (int)uVar1 >> 1;
    sample->loop_start = (int)uVar2 >> 1;
    sample->loop_end = sample->loop_end >> 1;
  }
  if (sample->loop_end != 0) {
    sample->loop_end = sample->loop_end + -1;
  }
  sample->default_pan = '\0';
  bVar3 = sample->flags;
  if (sample->length < 1) {
    bVar3 = bVar3 & 0xfe;
LAB_006e22fe:
    sample->flags = bVar3;
  }
  else if ((bVar3 & 0x10) != 0) {
    uVar4 = sample->loop_end;
    if (((uint)sample->length < uVar4) || (uVar4 <= (uint)sample->loop_start)) {
      bVar3 = bVar3 & 0xef;
      goto LAB_006e22fe;
    }
    sample->length = uVar4;
  }
  sample->finetune = 0;
  sample->vibrato_speed = '\0';
  sample->vibrato_depth = '\0';
  sample->vibrato_rate = '\0';
  sample->vibrato_waveform = '\0';
  sample->max_resampling_quality = -1;
LAB_006e2319:
  iVar5 = dumbfile_error(f);
  return iVar5;
}

Assistant:

static int it_ptm_read_sample_header(IT_SAMPLE *sample, int32 *offset, DUMBFILE *f)
{
	int flags;

	flags = dumbfile_getc(f);

    dumbfile_getnc((char *)sample->filename, 12, f);
	sample->filename[12] = 0;

	sample->default_volume = dumbfile_getc(f);

	sample->C5_speed = dumbfile_igetw(f) << 1;

	dumbfile_skip(f, 2); /* segment */

	*offset = dumbfile_igetl(f);

	sample->length = dumbfile_igetl(f);
	sample->loop_start = dumbfile_igetl(f);
	sample->loop_end = dumbfile_igetl(f);

	/* GUSBegin, GUSLStart, GUSLEnd, GUSLoop, reserverd */
	dumbfile_skip(f, 4+4+4+1+1);

    dumbfile_getnc((char *)sample->name, 28, f);
	sample->name[28] = 0;

	/*
	if (dumbfile_mgetl(f) != DUMB_ID('P','T','M','S'))
		return -1;
	*/

	/* BLAH! Shit likes to have broken or missing sample IDs */
	dumbfile_skip(f, 4);

	if ((flags & 3) == 0) {
		/* Looks like no sample */
		sample->flags &= ~IT_SAMPLE_EXISTS;
		return dumbfile_error(f);
	}

	sample->global_volume = 64;

	sample->flags = IT_SAMPLE_EXISTS;
	if (flags & 4) sample->flags |= IT_SAMPLE_LOOP;
	if (flags & 8) sample->flags |= IT_SAMPLE_PINGPONG_LOOP;

	if (flags & 16) {
		sample->flags |= IT_SAMPLE_16BIT;

		sample->length >>= 1;
		sample->loop_start >>= 1;
		sample->loop_end >>= 1;
	}

	if (sample->loop_end) sample->loop_end--;

	sample->default_pan = 0; // 0 = don't use, or 160 = centre?

	if (sample->length <= 0)
		sample->flags &= ~IT_SAMPLE_EXISTS;
	else if (sample->flags & IT_SAMPLE_LOOP) {
		if ((unsigned int)sample->loop_end > (unsigned int)sample->length)
			sample->flags &= ~IT_SAMPLE_LOOP;
		else if ((unsigned int)sample->loop_start >= (unsigned int)sample->loop_end)
			sample->flags &= ~IT_SAMPLE_LOOP;
		else
			sample->length = sample->loop_end;
	}


	//Do we need to set all these?
	sample->vibrato_speed = 0;
	sample->vibrato_depth = 0;
	sample->vibrato_rate = 0;
	sample->vibrato_waveform = IT_VIBRATO_SINE;
	sample->finetune = 0;
	sample->max_resampling_quality = -1;

	return dumbfile_error(f);
}